

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

bool __thiscall llvm::yaml::Scanner::consume(Scanner *this,uint32_t Expected)

{
  uint32_t Expected_local;
  Scanner *this_local;
  
  if (0x7f < Expected) {
    report_fatal_error("Not dealing with this yet",true);
  }
  if (this->Current == this->End) {
    this_local._7_1_ = false;
  }
  else {
    if (0x7f < (byte)*this->Current) {
      report_fatal_error("Not dealing with this yet",true);
    }
    if ((byte)*this->Current == Expected) {
      this->Current = this->Current + 1;
      this->Column = this->Column + 1;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Scanner::consume(uint32_t Expected) {
  if (Expected >= 0x80)
    report_fatal_error("Not dealing with this yet");
  if (Current == End)
    return false;
  if (uint8_t(*Current) >= 0x80)
    report_fatal_error("Not dealing with this yet");
  if (uint8_t(*Current) == Expected) {
    ++Current;
    ++Column;
    return true;
  }
  return false;
}